

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void testMinMaxEigenValue<Imath_3_2::Matrix44<double>>(Matrix44<double> *A)

{
  uint i;
  long lVar1;
  double (*padVar2) [4];
  uint j;
  long lVar3;
  double dVar4;
  double dVar5;
  Matrix44<double> V;
  Matrix44<double> U;
  TV maxV;
  TV minV;
  TV S;
  double local_258 [16];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  Vec4 local_158 [32];
  Vec4 local_138 [32];
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  local_1d8 = 0x3ff0000000000000;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1b0 = 0x3ff0000000000000;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0x3ff0000000000000;
  local_180 = 0;
  uStack_178 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_160 = 0x3ff0000000000000;
  local_258[0] = 1.0;
  local_258[1] = 0.0;
  local_258[2] = 0.0;
  local_258[3] = 0.0;
  local_258[4] = 0.0;
  local_258[5] = 1.0;
  local_258[6] = 0.0;
  local_258[7] = 0.0;
  local_258[8] = 0.0;
  local_258[9] = 0.0;
  local_258[10] = 1.0;
  local_258[0xb] = 0.0;
  local_258[0xc] = 0.0;
  local_258[0xd] = 0.0;
  local_258[0xe] = 0.0;
  local_258[0xf] = 1.0;
  dVar5 = 0.0;
  lVar1 = 0;
  padVar2 = (double (*) [4])A;
  do {
    lVar3 = 0;
    dVar4 = dVar5;
    do {
      dVar5 = ABS((*(double (*) [4])*padVar2)[lVar3]);
      if (dVar5 <= dVar4) {
        dVar5 = dVar4;
      }
      lVar3 = lVar3 + 1;
      dVar4 = dVar5;
    } while (lVar3 != 4);
    lVar1 = lVar1 + 1;
    padVar2 = padVar2 + 1;
  } while (lVar1 != 4);
  dVar4 = 2.220446049250313e-16;
  if (2.220446049250313e-16 <= dVar5) {
    dVar4 = dVar5;
  }
  dVar5 = dVar4 * 100.0 * 2.220446049250313e-16;
  local_98 = A->x[0][0];
  dStack_90 = A->x[0][1];
  local_88 = A->x[0][2];
  dStack_80 = A->x[0][3];
  local_78 = A->x[1][0];
  dStack_70 = A->x[1][1];
  local_68 = A->x[1][2];
  dStack_60 = A->x[1][3];
  local_58 = A->x[2][0];
  dStack_50 = A->x[2][1];
  local_48 = A->x[2][2];
  dStack_40 = A->x[2][3];
  local_38 = A->x[3][0];
  dStack_30 = A->x[3][1];
  local_28 = A->x[3][2];
  dStack_20 = A->x[3][3];
  Imath_3_2::minEigenVector<Imath_3_2::Matrix44<double>,Imath_3_2::Vec4<double>>
            ((Matrix44 *)&local_98,local_138);
  local_118 = A->x[0][0];
  dStack_110 = A->x[0][1];
  local_108 = A->x[0][2];
  dStack_100 = A->x[0][3];
  local_f8 = A->x[1][0];
  dStack_f0 = A->x[1][1];
  local_e8 = A->x[1][2];
  dStack_e0 = A->x[1][3];
  local_d8 = A->x[2][0];
  dStack_d0 = A->x[2][1];
  local_c8 = A->x[2][2];
  dStack_c0 = A->x[2][3];
  local_b8 = A->x[3][0];
  dStack_b0 = A->x[3][1];
  local_a8 = A->x[3][2];
  dStack_a0 = A->x[3][3];
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix44<double>,Imath_3_2::Vec4<double>>
            ((Matrix44 *)&local_118,local_158);
  local_98 = A->x[0][0];
  dStack_90 = A->x[0][1];
  local_88 = A->x[0][2];
  dStack_80 = A->x[0][3];
  local_78 = A->x[1][0];
  dStack_70 = A->x[1][1];
  local_68 = A->x[1][2];
  dStack_60 = A->x[1][3];
  local_58 = A->x[2][0];
  dStack_50 = A->x[2][1];
  local_48 = A->x[2][2];
  dStack_40 = A->x[2][3];
  local_38 = A->x[3][0];
  dStack_30 = A->x[3][1];
  local_28 = A->x[3][2];
  dStack_20 = A->x[3][3];
  lVar1 = 0;
  Imath_3_2::jacobiSVD<double>
            ((Matrix44 *)&local_98,(Matrix44 *)&local_1d8,(Vec4 *)&local_118,(Matrix44 *)local_258,
             2.220446049250313e-16,false);
  while( true ) {
    if (dVar5 <= ABS(*(double *)(local_138 + lVar1) -
                     *(double *)((long)local_258 + lVar1 * 4 + 0x18))) {
      __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<double>]"
                   );
    }
    if (dVar5 <= ABS(*(double *)(local_158 + lVar1) - *(double *)((long)local_258 + lVar1 * 4)))
    break;
    lVar1 = lVar1 + 8;
    if (lVar1 == 0x20) {
      return;
    }
  }
  __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<double>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}